

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::
_preBegin__profile_GLES__technique__pass__clear_stencil
          (ColladaParserAutoGen14Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  ParserChar *text;
  ParserChar *additionalText;
  bool bVar1;
  undefined8 in_RAX;
  profile_GLES__technique__pass__clear_stencil__AttributeData *ppVar2;
  undefined *puVar3;
  sint64 sVar4;
  xmlChar **ppxVar5;
  bool bVar6;
  undefined8 uStack_38;
  bool failed;
  
  uStack_38 = in_RAX;
  ppVar2 = GeneratedSaxParser::ParserTemplateBase::
           newData<COLLADASaxFWL14::profile_GLES__technique__pass__clear_stencil__AttributeData>
                     ((ParserTemplateBase *)this,attributeDataPtr);
  ppxVar5 = attributes->attributes;
  if (ppxVar5 == (xmlChar **)0x0) {
    bVar6 = true;
  }
  else {
    while( true ) {
      text = *ppxVar5;
      bVar6 = text == (ParserChar *)0x0;
      if (bVar6) break;
      puVar3 = (undefined *)GeneratedSaxParser::Utils::calculateStringHash(text);
      additionalText = ppxVar5[1];
      if (puVar3 == (undefined *)0x76887d) {
        ppVar2->param = additionalText;
      }
      else if (puVar3 == &DAT_007c83b5) {
        sVar4 = GeneratedSaxParser::Utils::toSint64(additionalText,&failed);
        ppVar2->value = sVar4;
        if (failed == true) {
          bVar6 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_ATTRIBUTE_PARSING_FAILED,0x81c1fc,0x7c83b5,additionalText);
          if (bVar6) {
            return false;
          }
        }
        if ((failed & 1U) == 0) {
          *(byte *)&ppVar2->present_attributes = (byte)ppVar2->present_attributes | 1;
        }
      }
      else {
        bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                          ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                           ERROR_UNKNOWN_ATTRIBUTE,0x81c1fc,text,additionalText);
        if (bVar1) {
          return bVar6;
        }
      }
      ppxVar5 = ppxVar5 + 2;
    }
  }
  return bVar6;
}

Assistant:

bool ColladaParserAutoGen14Private::_preBegin__profile_GLES__technique__pass__clear_stencil( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__profile_GLES__technique__pass__clear_stencil( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

profile_GLES__technique__pass__clear_stencil__AttributeData* attributeData = newData<profile_GLES__technique__pass__clear_stencil__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_value:
    {
bool failed;
attributeData->value = GeneratedSaxParser::Utils::toSint64(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_CLEAR_STENCIL,
        HASH_ATTRIBUTE_value,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= profile_GLES__technique__pass__clear_stencil__AttributeData::ATTRIBUTE_VALUE_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_param:
    {

attributeData->param = attributeValue;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NCName(attributeData->param, strlen(attributeData->param));
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_CLEAR_STENCIL,
            HASH_ATTRIBUTE_param,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_CLEAR_STENCIL, attribute, attributeValue))
            {return false;}
    }
    }
    }
}


    return true;
}